

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersections.c
# Opt level: O1

_Bool intersects_triangle_mesh(TriangleMesh mesh,Ray r)

{
  _Bool _Var1;
  BVHNode *in_stack_00000018;
  
  _Var1 = intersects_bvh(in_stack_00000018,(Ray)mesh);
  return _Var1;
}

Assistant:

bool intersects_triangle_mesh(TriangleMesh mesh, Ray r) {
#if USE_BVH
    return intersects_bvh(mesh.bvh_root, r);
#else
    bool did_intersect = false;
    for (int i = 0; i < mesh.triangle_count; i++) {
        if (intersects_triangle(mesh.triangles[i], r)) {
            did_intersect = true;
        }
    }
    return did_intersect;
#endif
}